

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall sing::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pthread_mutex_t *__mutex;
  pointer ptVar1;
  thread *thread;
  pointer ptVar2;
  
  __mutex = (pthread_mutex_t *)
            (this->pool_).super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::mutex::lock((mutex *)&__mutex->__data);
  ((this->pool_).super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ->stop = true;
  pthread_mutex_unlock(__mutex);
  std::condition_variable::notify_all();
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->pool_).
              super___shared_ptr<sing::ThreadPool::poolData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

~ThreadPool(){//pool_对象是线程池的成员，池析构时会调用pool对象的析构，这里表现为减少智能指针的引用计数
        if ((bool)pool_)
        {
            std::lock_guard<std::mutex> lock(pool_->mutex);
            pool_->stop = true;
        }
        pool_->cond.notify_all();
for(auto& thread:threads){
    thread.join();
}       
    }